

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

int AllocateAlphaPlane(VP8Decoder *dec,VP8Io *io)

{
  uint8_t *puVar1;
  undefined4 *in_RSI;
  VP8Decoder *in_RDI;
  uint64_t alpha_size;
  int height;
  int stride;
  int local_4;
  
  puVar1 = (uint8_t *)WebPSafeMalloc((uint64_t)in_RSI,CONCAT44(*in_RSI,in_RSI[0x21]));
  in_RDI->alpha_plane_mem_ = puVar1;
  if (in_RDI->alpha_plane_mem_ == (uint8_t *)0x0) {
    local_4 = VP8SetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
  }
  else {
    in_RDI->alpha_plane_ = in_RDI->alpha_plane_mem_;
    in_RDI->alpha_prev_line_ = (uint8_t *)0x0;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

WEBP_NODISCARD static int AllocateAlphaPlane(VP8Decoder* const dec,
                                             const VP8Io* const io) {
  const int stride = io->width;
  const int height = io->crop_bottom;
  const uint64_t alpha_size = (uint64_t)stride * height;
  assert(dec->alpha_plane_mem_ == NULL);
  dec->alpha_plane_mem_ =
      (uint8_t*)WebPSafeMalloc(alpha_size, sizeof(*dec->alpha_plane_));
  if (dec->alpha_plane_mem_ == NULL) {
    return VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                       "Alpha decoder initialization failed.");
  }
  dec->alpha_plane_ = dec->alpha_plane_mem_;
  dec->alpha_prev_line_ = NULL;
  return 1;
}